

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat4x2.c
# Opt level: O0

void glmc_mat4x2_mul(vec2 *m1,vec4 *m2,vec2 *dest)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  vec2 *dest_local;
  vec4 *m2_local;
  vec2 *m1_local;
  float b13;
  float b12;
  float b11;
  float b10;
  float b03;
  float b02;
  float b01;
  float b00;
  float a31;
  float a30;
  float a21;
  float a20;
  float a11;
  float a10;
  float a01;
  float a00;
  
  fVar1 = (*m1)[0];
  fVar2 = (*m1)[1];
  fVar3 = m1[1][0];
  fVar4 = m1[1][1];
  fVar5 = m1[2][0];
  fVar6 = m1[2][1];
  fVar7 = m1[3][0];
  fVar8 = m1[3][1];
  fVar9 = (*m2)[0];
  fVar10 = (*m2)[1];
  fVar11 = (*m2)[2];
  fVar12 = (*m2)[3];
  fVar13 = m2[1][0];
  fVar14 = m2[1][1];
  fVar15 = m2[1][2];
  fVar16 = m2[1][3];
  (*dest)[0] = fVar7 * fVar12 + fVar5 * fVar11 + fVar1 * fVar9 + fVar3 * fVar10;
  (*dest)[1] = fVar8 * fVar12 + fVar6 * fVar11 + fVar2 * fVar9 + fVar4 * fVar10;
  dest[1][0] = fVar7 * fVar16 + fVar5 * fVar15 + fVar1 * fVar13 + fVar3 * fVar14;
  dest[1][1] = fVar8 * fVar16 + fVar6 * fVar15 + fVar2 * fVar13 + fVar4 * fVar14;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_mat4x2_mul(mat4x2 m1, mat2x4 m2, mat2 dest) {
  glm_mat4x2_mul(m1, m2, dest);
}